

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O1

symbol * evaluate_member_dereference(dmr_C *C,expression *expr)

{
  dmr_C *C_00;
  ulong uVar1;
  allocator *paVar2;
  position pVar3;
  long lVar4;
  dmr_C *C_01;
  char cVar5;
  symbol *psVar6;
  symbol *__dest;
  expression_list *peVar7;
  expression *peVar8;
  char *pcVar9;
  uint uVar10;
  int *piVar11;
  char *fmt;
  expression_list *sym;
  char *pcVar12;
  undefined1 local_4c [8];
  int offset;
  int *local_40;
  position local_38;
  
  peVar7 = (expr->field_5).expr_list;
  C_00 = (dmr_C *)(expr->field_5).field_4.symbol_name;
  psVar6 = dmrC_evaluate_expression(C,(expression *)peVar7);
  if (psVar6 == (symbol *)0x0) {
    return (symbol *)0x0;
  }
  if (C_00 == (dmr_C *)0x0) {
    pcVar12 = "bad member name";
LAB_0010cef9:
    dmrC_expression_error(C,expr,pcVar12);
    return (symbol *)0x0;
  }
  sym = peVar7->next_;
  dmrC_examine_symbol_type(C->S,(symbol *)sym);
  local_38._0_4_ = *(undefined4 *)(sym->list_ + 0xb);
  local_40 = (int *)sym->list_[8];
  if (*(char *)sym == '\x03') {
    sym = (expression_list *)sym->list_[0xc];
    local_38._0_4_ = local_38._0_4_ | *(uint *)(sym->list_ + 0xb);
    local_40 = (int *)((ulong)local_40 | (ulong)sym->list_[8]);
  }
  unique0x100004d5 = C;
  if ((sym == (expression_list *)0x0) || (1 < *(byte *)sym - 7)) {
    pcVar12 = "expected structure or union";
    goto LAB_0010cef9;
  }
  local_4c._0_4_ = 0;
  psVar6 = find_identifier(C_00,(ident *)sym->list_[0xf],(symbol_list *)local_4c,local_40);
  C_01 = stack0xffffffffffffffb8;
  if (psVar6 == (symbol *)0x0) {
    local_40 = (int *)0x1380bd;
    if (*(byte *)sym == 7) {
      local_40 = (int *)0x13d0d4;
    }
    paVar2 = sym->allocator_;
    if (paVar2 == (allocator *)0x0) {
      local_38._0_4_ = 9;
      pcVar12 = "<unnamed>";
    }
    else {
      local_38._0_4_ = ZEXT14((byte)paVar2->size_);
      pcVar12 = (char *)((long)&paVar2->size_ + 2);
    }
    lVar4 = (long)sym->list_[0xf];
    pcVar9 = dmrC_show_ident(stack0xffffffffffffffb8,(ident *)C_00);
    if (lVar4 == 0) {
      fmt = "using member \'%s\' in incomplete %s %.*s";
    }
    else {
      fmt = "no member \'%s\' in %s %.*s";
    }
    dmrC_expression_error(C_01,expr,fmt,pcVar9,local_40,(ulong)local_38 & 0xffffffff,pcVar12);
    return (symbol *)0x0;
  }
  uVar1 = (psVar6->field_14).field_2.ctype.modifiers;
  piVar11 = (int *)((ulong)local_40 | uVar1);
  if ((*(uint *)((long)&psVar6->field_14 + 0x30) != local_38._0_4_) || ((int)piVar11 != (int)uVar1))
  {
    local_40 = piVar11;
    __dest = dmrC_alloc_symbol(stack0xffffffffffffffb8->S,psVar6->pos,3);
    memcpy(__dest,psVar6,0xe8);
    *(undefined4 *)((long)&__dest->field_14 + 0x30) = local_38._0_4_;
    *(long *)((long)&__dest->field_14 + 0x18) = (long)(int)local_40;
    psVar6 = __dest;
  }
  dmrC_examine_symbol_type(C_01->S,(psVar6->field_14).field_2.ctype.base_type);
  cVar5 = (char)*(ushort *)peVar7;
  if (cVar5 == '\x1d') {
LAB_0010d0cc:
    (expr->field_5).field_0.value =
         (((anon_union_32_18_55d8ca1e_for_expression_5 *)peVar7->list_)->field_0).value;
    uVar10 = (((anon_union_32_18_55d8ca1e_for_expression_5 *)peVar7->list_)->field_0).taint;
  }
  else {
    if (cVar5 == '\t') {
      if (*(int *)&peVar7->field_0x4 == 0x2a) {
        peVar8 = (((anon_union_32_18_55d8ca1e_for_expression_5 *)peVar7->list_)->field_3).unop;
        (expr->field_5).field_3.unop = peVar8;
        local_40 = (int *)(long)(int)local_4c._0_4_;
        local_38 = peVar8->pos;
        paVar2 = &stack0xffffffffffffffb8->expression_allocator;
        peVar7 = (expression_list *)dmrC_allocator_allocate(paVar2,0);
        *(undefined1 *)peVar7 = 5;
        peVar7->prev_ = (expression_list *)local_38;
        *(undefined4 *)&peVar7->field_0x4 = 0x2b;
        peVar7->list_[0] = peVar8;
        pVar3 = peVar8->pos;
        peVar8 = (expression *)dmrC_allocator_allocate(paVar2,0);
        *(undefined1 *)peVar8 = 1;
        peVar8->pos = pVar3;
        peVar7->list_[1] = peVar8;
        peVar8->ctype = &stack0xffffffffffffffb8->S->int_ctype;
        *(int **)&peVar7->list_[1]->field_5 = local_40;
        peVar7->next_ = (expression_list *)&stack0xffffffffffffffb8->S->lazy_ptr_ctype;
        *(undefined1 *)expr = 9;
        expr->op = 0x2a;
        (expr->field_5).expr_list = peVar7;
        goto LAB_0010d10c;
      }
      if ((*(ushort *)peVar7 & 0xff) == 0x1d) goto LAB_0010d0cc;
    }
    (expr->field_5).expr_list = peVar7;
    uVar10 = 0;
  }
  (expr->field_5).field_0.taint = uVar10;
  uVar10 = stack0xffffffffffffffb8->target->bits_in_char * local_4c._0_4_ + uVar10;
  (expr->field_5).field_0.taint = uVar10;
  *(undefined1 *)expr = 0x1d;
  (expr->field_5).field_8.r_nrbits = (psVar6->field_14).field_1.normal;
  (expr->field_5).field_0.taint = *(byte *)((long)&psVar6->field_14 + 0xc) + uVar10;
LAB_0010d10c:
  expr->ctype = psVar6;
  return psVar6;
}

Assistant:

static struct symbol *evaluate_member_dereference(struct dmr_C *C, struct expression *expr)
{
	int offset;
	struct symbol *ctype, *member;
	struct expression *deref = expr->deref, *add;
	struct ident *ident = expr->member;
	unsigned int mod;
	int address_space;

	if (!dmrC_evaluate_expression(C, deref))
		return NULL;
	if (!ident) {
		dmrC_expression_error(C, expr, "bad member name");
		return NULL;
	}

	ctype = deref->ctype;
	dmrC_examine_symbol_type(C->S, ctype);
	address_space = ctype->ctype.as;
	mod = ctype->ctype.modifiers;
	if (ctype->type == SYM_NODE) {
		ctype = ctype->ctype.base_type;
		address_space |= ctype->ctype.as;
		mod |= ctype->ctype.modifiers;
	}
	if (!ctype || (ctype->type != SYM_STRUCT && ctype->type != SYM_UNION)) {
		dmrC_expression_error(C, expr, "expected structure or union");
		return NULL;
	}
	offset = 0;
	member = find_identifier(C, ident, ctype->symbol_list, &offset);
	if (!member) {
		const char *type = ctype->type == SYM_STRUCT ? "struct" : "union";
		const char *name = "<unnamed>";
		int namelen = 9;
		if (ctype->ident) {
			name = ctype->ident->name;
			namelen = ctype->ident->len;
		}
		if (ctype->symbol_list)
			dmrC_expression_error(C, expr, "no member '%s' in %s %.*s",
				dmrC_show_ident(C, ident), type, namelen, name);
		else
			dmrC_expression_error(C, expr, "using member '%s' in "
				"incomplete %s %.*s", dmrC_show_ident(C, ident),
				type, namelen, name);
		return NULL;
	}

	/*
	 * The member needs to take on the address space and modifiers of
	 * the "parent" type.
	 */
	member = convert_to_as_mod(C, member, address_space, mod);
	ctype = dmrC_get_base_type(C->S, member);

	if (!lvalue_expression(C, deref)) {
		if (deref->type != EXPR_SLICE) {
			expr->base = deref;
			expr->r_bitpos = 0;
		} else {
			expr->base = deref->base;
			expr->r_bitpos = deref->r_bitpos;
		}
		expr->r_bitpos += dmrC_bytes_to_bits(C->target, offset);
		expr->type = EXPR_SLICE;
		expr->r_nrbits = member->bit_size;
		expr->r_bitpos += member->bit_offset;
		expr->ctype = member;
		return member;
	}

	deref = deref->unop;
	expr->deref = deref;

	add = evaluate_offset(C, deref, offset);
	expr->type = EXPR_PREOP;
	expr->op = '*';
	expr->unop = add;

	expr->ctype = member;
	return member;
}